

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicRMW(BinaryenModuleRef module,BinaryenOp op,BinaryenIndex bytes,BinaryenIndex offset,
                 BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
                 char *memoryName)

{
  BinaryenExpressionRef value_00;
  BinaryenExpressionRef ptr_00;
  uint bytes_00;
  BinaryenIndex op_00;
  AtomicRMW *pAVar1;
  Name memory;
  Type local_48;
  Address local_40;
  Builder local_38;
  BinaryenExpressionRef local_30;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef ptr_local;
  uint local_18;
  BinaryenIndex offset_local;
  BinaryenIndex bytes_local;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_30 = value;
  value_local = ptr;
  ptr_local._4_4_ = offset;
  local_18 = bytes;
  offset_local = op;
  _bytes_local = module;
  wasm::Builder::Builder(&local_38,module);
  op_00 = offset_local;
  bytes_00 = local_18;
  wasm::Address::Address(&local_40,(ulong)ptr_local._4_4_);
  ptr_00 = value_local;
  value_00 = local_30;
  wasm::Type::Type(&local_48,type);
  memory = getMemoryName(_bytes_local,memoryName);
  pAVar1 = wasm::Builder::makeAtomicRMW
                     (&local_38,op_00,bytes_00,local_40,ptr_00,value_00,local_48,memory);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicRMW(BinaryenModuleRef module,
                                        BinaryenOp op,
                                        BinaryenIndex bytes,
                                        BinaryenIndex offset,
                                        BinaryenExpressionRef ptr,
                                        BinaryenExpressionRef value,
                                        BinaryenType type,
                                        const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicRMW(AtomicRMWOp(op),
                     bytes,
                     offset,
                     (Expression*)ptr,
                     (Expression*)value,
                     Type(type),
                     getMemoryName(module, memoryName)));
}